

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

size_t raviX_del_array_element(void *a,size_t element_size,size_t array_size,size_t i,size_t n)

{
  long lVar1;
  size_t oldsize;
  size_t newsize;
  size_t new_array_size;
  size_t count;
  char *src;
  char *dest;
  char *p;
  size_t n_local;
  size_t i_local;
  size_t array_size_local;
  size_t element_size_local;
  void *a_local;
  
  if (i + n <= array_size) {
    memmove((void *)((long)a + i * element_size),(void *)((long)a + (i + n) * element_size),
            element_size * ((array_size - n) - i));
    lVar1 = element_size * (array_size - n);
    memset((void *)((long)a + lVar1),0,element_size * array_size - lVar1);
    return array_size - n;
  }
  __assert_fail("i + n <= array_size",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/allocate.c"
                ,0x53,"size_t raviX_del_array_element(void *, size_t, size_t, size_t, size_t)");
}

Assistant:

size_t raviX_del_array_element(void *a, size_t element_size, size_t array_size, size_t i, size_t n)
{
	assert(i + n <= array_size);
	char *p = (char *)a;
	char *dest = p + i * element_size;
	char const *src = p + (i + n) * element_size;
	size_t count = element_size * (array_size - n - i);
	memmove(dest, src, count);
	size_t new_array_size = array_size - n;
	size_t newsize = element_size * new_array_size;
	size_t oldsize = element_size * array_size;
	memset(p + newsize, 0, oldsize - newsize);
	return new_array_size;
}